

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RenderDesc.cpp
# Opt level: O0

Expected<void,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> *
__thiscall
renderdesc::Loader::load_abi_cxx11_
          (Expected<void,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           *__return_storage_ptr__,Loader *this)

{
  Mapping *pMVar1;
  bool bVar2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar3;
  Unexpected<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_1a0;
  undefined1 local_180 [8];
  Expected<void,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  result_3;
  undefined1 local_138 [8];
  Expected<void,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  result_2;
  undefined1 local_f0 [8];
  Expected<void,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  result_1;
  string local_c0;
  uint local_9c;
  Unexpected<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_98;
  undefined1 local_78 [8];
  Expected<void,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  result;
  allocator<char> local_39;
  string local_38;
  Loader *local_18;
  Loader *this_local;
  
  pMVar1 = this->root_;
  local_18 = this;
  this_local = (Loader *)__return_storage_ptr__;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_38,"framebuffers",&local_39);
  bVar2 = yaml::Mapping::hasKey(pMVar1,&local_38);
  std::__cxx11::string::~string((string *)&local_38);
  std::allocator<char>::~allocator(&local_39);
  if (bVar2) {
    loadFramebuffers_abi_cxx11_
              ((Expected<void,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                *)local_78,this);
    bVar2 = ::Expected::operator_cast_to_bool((Expected *)local_78);
    if (!bVar2) {
      pbVar3 = Expected<void,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               ::error((Expected<void,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        *)local_78);
      Unexpected<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      Unexpected(&local_98,pbVar3);
      Expected<void,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::Expected(__return_storage_ptr__,&local_98);
      Unexpected<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      ~Unexpected(&local_98);
    }
    local_9c = (uint)!bVar2;
    Expected<void,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~Expected((Expected<void,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 *)local_78);
    if (local_9c != 0) {
      return __return_storage_ptr__;
    }
  }
  pMVar1 = this->root_;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_c0,"textures",(allocator<char> *)&result_1.field_0x27);
  bVar2 = yaml::Mapping::hasKey(pMVar1,&local_c0);
  std::__cxx11::string::~string((string *)&local_c0);
  std::allocator<char>::~allocator((allocator<char> *)&result_1.field_0x27);
  if (bVar2) {
    loadTextures_abi_cxx11_
              ((Expected<void,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                *)local_f0,this);
    bVar2 = ::Expected::operator_cast_to_bool((Expected *)local_f0);
    if (!bVar2) {
      pbVar3 = Expected<void,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               ::error((Expected<void,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        *)local_f0);
      Unexpected<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      Unexpected((Unexpected<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&result_2.has_value_,pbVar3);
      Expected<void,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::Expected(__return_storage_ptr__,(UnexpectedType *)&result_2.has_value_);
      Unexpected<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      ~Unexpected((Unexpected<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&result_2.has_value_);
    }
    local_9c = (uint)!bVar2;
    Expected<void,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~Expected((Expected<void,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 *)local_f0);
    if (local_9c != 0) {
      return __return_storage_ptr__;
    }
  }
  loadPrograms_abi_cxx11_
            ((Expected<void,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *)local_138,this);
  bVar2 = ::Expected::operator_cast_to_bool((Expected *)local_138);
  if (!bVar2) {
    pbVar3 = Expected<void,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             ::error((Expected<void,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      *)local_138);
    Unexpected<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    Unexpected((Unexpected<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                *)&result_3.has_value_,pbVar3);
    Expected<void,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::Expected(__return_storage_ptr__,(UnexpectedType *)&result_3.has_value_);
    Unexpected<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    ~Unexpected((Unexpected<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 *)&result_3.has_value_);
  }
  local_9c = (uint)!bVar2;
  Expected<void,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~Expected((Expected<void,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             *)local_138);
  if (local_9c == 0) {
    loadCommands_abi_cxx11_
              ((Expected<void,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                *)local_180,this);
    bVar2 = ::Expected::operator_cast_to_bool((Expected *)local_180);
    if (!bVar2) {
      pbVar3 = Expected<void,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               ::error((Expected<void,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        *)local_180);
      Unexpected<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      Unexpected(&local_1a0,pbVar3);
      Expected<void,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::Expected(__return_storage_ptr__,&local_1a0);
      Unexpected<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      ~Unexpected(&local_1a0);
    }
    local_9c = (uint)!bVar2;
    Expected<void,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~Expected((Expected<void,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 *)local_180);
    if (local_9c == 0) {
      Expected<void,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::Expected(__return_storage_ptr__);
    }
  }
  return __return_storage_ptr__;
}

Assistant:

Expected<void, std::string> load() {
		if (root_.hasKey("framebuffers")) {
			auto result = loadFramebuffers();
			if (!result)
				return Unexpected(result.error());
		}

		if (root_.hasKey("textures")) {
			auto result = loadTextures();
			if (!result)
				return Unexpected(result.error());
		}

		{
			auto result = loadPrograms();
			if (!result)
				return Unexpected(result.error());
		}

		{
			auto result = loadCommands();
			if (!result)
				return Unexpected(result.error());
		}

		return Expected<void, std::string>();
	}